

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  byte bVar1;
  ushort uVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  TValue *key;
  int *piVar5;
  TString *key_00;
  TValue *slot;
  char *pcVar6;
  
  key_00 = luaS_new(L,k);
  if ((t->tt_ & 0xf) == 5) {
    if (t->tt_ != 0x8005) {
      pcVar6 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_00110b52:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x280,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    if (((Table *)(t->value_).gc)->tt != '\x05') {
      pcVar6 = "(((t)->value_).gc)->tt == 5";
      goto LAB_00110b52;
    }
    slot = luaH_getstr((Table *)(t->value_).gc,key_00);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      pGVar4 = (slot->value_).gc;
      (pTVar3->value_).gc = pGVar4;
      uVar2 = slot->tt_;
      pTVar3->tt_ = uVar2;
      if (((short)uVar2 < 0) &&
         (((uVar2 & 0x7f) != (ushort)pGVar4->tt ||
          ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x281,"int auxgetstr(lua_State *, const TValue *, const char *)");
      }
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      if (L->ci->top < pTVar3 + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x282,"int auxgetstr(lua_State *, const TValue *, const char *)");
      }
      goto LAB_00110ac3;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  if ((key_00->tt & 0xe) < 10) {
    pTVar3 = L->top;
    (pTVar3->value_).gc = (GCObject *)key_00;
    bVar1 = key_00->tt;
    pTVar3->tt_ = bVar1 | 0x8000;
    if ((-1 < (char)bVar1) && ((key_00->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      key = L->top;
      L->top = key + 1;
      if (L->ci->top < key + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x286,"int auxgetstr(lua_State *, const TValue *, const char *)");
      }
      luaV_finishget(L,t,key,key,slot);
LAB_00110ac3:
      piVar5 = *(int **)&L[-1].hookmask;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        return L->top[-1].tt_ & 0xf;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x289,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    pcVar6 = "0";
  }
  else {
    pcVar6 = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x285,"int auxgetstr(lua_State *, const TValue *, const char *)");
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    setobj2s(L, L->top, slot);
    api_incr_top(L);
  }
  else {
    setsvalue2s(L, L->top, str);
    api_incr_top(L);
    luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}